

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O0

void layout_menu(gamewin *gw)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  size_t sVar4;
  wchar_t local_a8;
  wchar_t local_a4;
  wchar_t local_a0;
  int local_9c;
  wchar_t local_94;
  int local_90;
  int local_8c;
  int local_88;
  wchar_t local_84;
  wchar_t singlewidth;
  wchar_t scrwidth;
  wchar_t scrheight;
  wchar_t colwidth [16];
  wchar_t y2;
  wchar_t y1;
  wchar_t x2;
  wchar_t x1;
  wchar_t w;
  wchar_t col;
  wchar_t i;
  win_menu *mdat;
  gamewin *gw_local;
  
  local_84 = L'\0';
  if (*(int *)((long)&gw[4].resize + 4) < 1) {
    local_88 = 0;
  }
  else {
    local_88 = *(int *)((long)&gw[4].resize + 4);
  }
  if (*(int *)&gw[4].win < 1) {
    local_8c = 0;
  }
  else {
    local_8c = *(int *)&gw[4].win;
  }
  if ((*(int *)((long)&gw[4].win + 4) < 1) || (_COLS < *(int *)((long)&gw[4].win + 4))) {
    local_90 = _COLS;
  }
  else {
    local_90 = *(int *)((long)&gw[4].win + 4);
  }
  if ((*(int *)&gw[4].next < 1) || (_LINES < *(wchar_t *)&gw[4].next)) {
    local_94 = _LINES;
  }
  else {
    local_94 = *(wchar_t *)&gw[4].next;
  }
  colwidth[0xf] = local_94;
  *(undefined4 *)&gw[2].resize = 2;
  if ((gw[1].next != (gamewin *)0x0) && (*(char *)&(gw[1].next)->draw != '\0')) {
    *(int *)&gw[2].resize = *(int *)&gw[2].resize + 2;
  }
  if (*(int *)&gw[1].prev < 0x34) {
    local_9c = *(int *)&gw[1].prev;
  }
  else {
    local_9c = 0x34;
  }
  *(int *)((long)&gw[2].draw + 4) = *(int *)&gw[2].resize + local_9c;
  if (local_94 - local_8c < *(int *)((long)&gw[2].draw + 4)) {
    *(wchar_t *)((long)&gw[2].draw + 4) = local_94 - local_8c;
  }
  *(int *)((long)&gw[2].resize + 4) = *(int *)((long)&gw[2].draw + 4) - *(int *)&gw[2].resize;
  *(undefined4 *)&gw[4].resize = 0;
  for (w = L'\0'; w < L'\x10'; w = w + L'\x01') {
    (&scrwidth)[w] = L'\0';
  }
  for (w = L'\0'; w < *(wchar_t *)&gw[1].prev; w = w + L'\x01') {
    pcVar3 = strchr((char *)(gw[1].resize + (long)w * 0x10c + 8),9);
    if (pcVar3 == (char *)0x0) {
      sVar4 = strlen((char *)(gw[1].resize + (long)w * 0x10c + 8));
      x2 = (wchar_t)sVar4;
      if ((*(int *)(gw[1].resize + (long)w * 0x10c + 4) == 1) &&
         (*(int *)(gw[1].resize + (long)w * 0x10c) != 0)) {
        x2 = x2 + L'\x04';
      }
      if (x2 < local_84) {
        local_a0 = local_84;
      }
      else {
        local_a0 = x2;
      }
      local_84 = local_a0;
    }
    else {
      local_a4 = calc_colwidths((char *)(gw[1].resize + (long)w * 0x10c + 8),&scrwidth);
      if (local_a4 < *(wchar_t *)&gw[4].resize) {
        local_a4 = *(wchar_t *)&gw[4].resize;
      }
      *(wchar_t *)&gw[4].resize = local_a4;
    }
  }
  if (*(int *)((long)&gw[1].prev + 4) != 0) {
    scrwidth = scrwidth + L'\x04';
  }
  wVar2 = calc_menuwidth(&scrwidth,(wchar_t *)&gw[2].next,*(wchar_t *)&gw[4].resize);
  if (local_84 < wVar2) {
    local_a8 = calc_menuwidth(&scrwidth,(wchar_t *)&gw[2].next,*(wchar_t *)&gw[4].resize);
  }
  else {
    local_a8 = local_84;
  }
  *(wchar_t *)((long)&gw[2].win + 4) = local_a8;
  if ((local_90 - local_88) + -4 < *(int *)((long)&gw[2].win + 4)) {
    *(int *)((long)&gw[2].win + 4) = (local_90 - local_88) + -4;
  }
  *(int *)&gw[2].win = *(int *)((long)&gw[2].win + 4) + 4;
  *(int *)((long)&gw[2].next + (long)(*(int *)&gw[4].resize + 1) * 4) =
       *(int *)((long)&gw[2].win + 4) + 1;
  if ((gw[1].next != (gamewin *)0x0) &&
     (iVar1 = *(int *)&gw[2].win, sVar4 = strlen((char *)gw[1].next), (ulong)(long)iVar1 < sVar4 + 4
     )) {
    sVar4 = strlen((char *)gw[1].next);
    *(int *)((long)&gw[2].win + 4) = (int)sVar4;
    *(int *)&gw[2].win = *(int *)((long)&gw[2].win + 4) + 4;
  }
  return;
}

Assistant:

static void layout_menu(struct gamewin *gw)
{
    struct win_menu *mdat = (struct win_menu*)gw->extra;
    int i, col, w, x1, x2, y1, y2;
    int colwidth[MAXCOLS];
    int scrheight;
    int scrwidth;
    int singlewidth = 0;
    
    x1 = (mdat->x1 > 0) ? mdat->x1 : 0;
    y1 = (mdat->y1 > 0) ? mdat->y1 : 0;
    x2 = (mdat->x2 > 0 && mdat->x2 <= COLS) ? mdat->x2 : COLS;
    y2 = (mdat->y2 > 0 && mdat->y2 <= LINES) ? mdat->y2 : LINES;
    
    scrheight = y2 - y1;
    scrwidth = x2 - x1;
    
    /* calc height */
    mdat->frameheight = 2;
    if (mdat->title && mdat->title[0]) {
	mdat->frameheight += 2; /* window title + space */
    }
	
    mdat->height = mdat->frameheight + min(mdat->icount, 52);
    if (mdat->height > scrheight)
	mdat->height = scrheight;
    mdat->innerheight = mdat->height - mdat->frameheight;
    
    /* calc width */
    mdat->maxcol = 0;
    for (i = 0; i < MAXCOLS; i++)
	colwidth[i] = 0;
    
    for (i = 0; i < mdat->icount; i++) {
	/* headings without tabs are not fitted into columns, but headers with
	 * tabs are presumably column titles */
	if (!strchr(mdat->items[i].caption, '\t')) {
	    w = strlen(mdat->items[i].caption);
	    if (mdat->items[i].role == MI_NORMAL && mdat->items[i].id)
		w += 4;
	    singlewidth = max(singlewidth, w);
	} else {
	    col = calc_colwidths(mdat->items[i].caption, colwidth);
	    mdat->maxcol = max(mdat->maxcol, col);
	}
    }
    if (mdat->how != PICK_NONE)
	colwidth[0] += 4; /* "a - " */
    
    mdat->innerwidth = max(calc_menuwidth(colwidth, mdat->colpos, mdat->maxcol),
			   singlewidth);
    if (mdat->innerwidth > scrwidth - 4)/* make sure there is space for window borders */
	mdat->innerwidth = scrwidth - 4;
    mdat->width = mdat->innerwidth + 4; /* border + space */
    mdat->colpos[mdat->maxcol+1] = mdat->innerwidth+1;
    
    if (mdat->title && mdat->width < strlen(mdat->title) + 4) {
	mdat->innerwidth = strlen(mdat->title);
	mdat->width = mdat->innerwidth + 4;
    }
}